

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O0

void __thiscall
so_5::agent_t::create_event_subscription
          (agent_t *this,mbox_t *mbox_ref,type_index msg_type,state_t *target_state,
          event_handler_method_t *method,thread_safety_t thread_safety)

{
  pointer psVar1;
  control_block_t *pcVar2;
  thread_safety_t thread_safety_local;
  event_handler_method_t *method_local;
  state_t *target_state_local;
  mbox_t *mbox_ref_local;
  agent_t *this_local;
  type_index msg_type_local;
  
  this_local = (agent_t *)msg_type._M_target;
  ensure_operation_is_on_working_thread(this,"create_event_subscription");
  psVar1 = std::
           unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>
           ::operator->(&this->m_subscriptions);
  pcVar2 = detect_limit_for_message_type(this,(type_index *)&this_local);
  (*psVar1->_vptr_subscription_storage_t[2])
            (psVar1,mbox_ref,&this_local,pcVar2,target_state,method,(uint)thread_safety);
  return;
}

Assistant:

void
agent_t::create_event_subscription(
	const mbox_t & mbox_ref,
	std::type_index msg_type,
	const state_t & target_state,
	const event_handler_method_t & method,
	thread_safety_t thread_safety )
{
	// Since v.5.4.0 there is no need for locking agent's mutex
	// because this operation can be performed only on agent's
	// working thread.

	ensure_operation_is_on_working_thread( "create_event_subscription" );

	m_subscriptions->create_event_subscription(
			mbox_ref,
			msg_type,
			detect_limit_for_message_type( msg_type ),
			target_state,
			method,
			thread_safety );
}